

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-init.c
# Opt level: O3

parser_error parse_lore_base(parser *p)

{
  void *pvVar1;
  char *name;
  monster_base *pmVar2;
  parser_error pVar3;
  
  pvVar1 = parser_priv(p);
  name = parser_getsym(p,"base");
  pmVar2 = lookup_monster_base(name);
  pVar3 = PARSE_ERROR_NONE;
  if (pvVar1 != (void *)0x0) {
    if (pmVar2 == (monster_base *)0x0) {
      pVar3 = PARSE_ERROR_INVALID_MONSTER_BASE;
    }
    else {
      *(undefined1 *)((long)pvVar1 + 0x60) = 1;
      flag_setall((bitflag *)((long)pvVar1 + 0x20),0xc);
      pVar3 = PARSE_ERROR_NONE;
    }
  }
  return pVar3;
}

Assistant:

static enum parser_error parse_lore_base(struct parser *p) {
	struct monster_lore *l = parser_priv(p);
	struct monster_base *base = lookup_monster_base(parser_getsym(p, "base"));

	if (!l)
		return PARSE_ERROR_NONE;
	if (base == NULL)
		return PARSE_ERROR_INVALID_MONSTER_BASE;

	/* Know everything */
	l->all_known = true;
	rf_setall(l->flags);

	return PARSE_ERROR_NONE;
}